

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O0

Gia_Man_t *
Gia_ManAreaBalance(Gia_Man_t *p,int fSimpleAnd,int nNewNodesMax,int fVerbose,int fVeryVerbose)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  float fVar6;
  Gia_Man_t *local_c0;
  Gia_Man_t *local_b8;
  int local_8c;
  int local_64;
  int local_5c;
  int And2Delay_1;
  int Id_1;
  int i_1;
  int And2Delay;
  int Id;
  int i;
  Vec_Int_t *vCiLevels;
  Gia_Man_t *pNew2;
  Gia_Man_t *pNew1;
  Gia_Man_t *pNew;
  Gia_Man_t *pNew0;
  int fVeryVerbose_local;
  int fVerbose_local;
  int nNewNodesMax_local;
  int fSimpleAnd_local;
  Gia_Man_t *p_local;
  
  pNew0._0_4_ = fVeryVerbose;
  pNew0._4_4_ = fVerbose;
  fVeryVerbose_local = nNewNodesMax;
  fVerbose_local = fSimpleAnd;
  _nNewNodesMax_local = p;
  if (p->vCiArrs == (Vec_Int_t *)0x0) {
    if (p->vInArrs != (Vec_Flt_t *)0x0) {
      if (p->And2Delay == 0) {
        local_8c = 1;
      }
      else {
        local_8c = p->And2Delay;
      }
      And2Delay_1 = 0;
      while( true ) {
        iVar2 = Vec_IntSize(_nNewNodesMax_local->vCis);
        pGVar1 = _nNewNodesMax_local;
        bVar5 = false;
        if (And2Delay_1 < iVar2) {
          pGVar4 = Gia_ManCi(_nNewNodesMax_local,And2Delay_1);
          local_5c = Gia_ObjId(pGVar1,pGVar4);
          bVar5 = local_5c != 0;
        }
        if (!bVar5) break;
        pVVar3 = _nNewNodesMax_local->vLevels;
        fVar6 = Vec_FltEntry(_nNewNodesMax_local->vInArrs,And2Delay_1);
        Vec_IntWriteEntry(pVVar3,local_5c,(int)(fVar6 / (float)local_8c));
        And2Delay_1 = And2Delay_1 + 1;
      }
    }
  }
  else {
    if (p->And2Delay == 0) {
      local_64 = 1;
    }
    else {
      local_64 = p->And2Delay;
    }
    Vec_IntFreeP(&p->vLevels);
    iVar2 = Gia_ManObjNum(_nNewNodesMax_local);
    pVVar3 = Vec_IntStart(iVar2);
    _nNewNodesMax_local->vLevels = pVVar3;
    And2Delay = 0;
    while( true ) {
      iVar2 = Vec_IntSize(_nNewNodesMax_local->vCis);
      pGVar1 = _nNewNodesMax_local;
      bVar5 = false;
      if (And2Delay < iVar2) {
        pGVar4 = Gia_ManCi(_nNewNodesMax_local,And2Delay);
        i_1 = Gia_ObjId(pGVar1,pGVar4);
        bVar5 = i_1 != 0;
      }
      if (!bVar5) break;
      pVVar3 = _nNewNodesMax_local->vLevels;
      iVar2 = Vec_IntEntry(_nNewNodesMax_local->vCiArrs,And2Delay);
      Vec_IntWriteEntry(pVVar3,i_1,iVar2 / local_64);
      And2Delay = And2Delay + 1;
    }
  }
  if ((_nNewNodesMax_local->pManTime != (void *)0x0) &&
     (_nNewNodesMax_local->vLevels == (Vec_Int_t *)0x0)) {
    Gia_ManLevelWithBoxes(_nNewNodesMax_local);
  }
  _Id = Gia_ManGetCiLevels(_nNewNodesMax_local);
  iVar2 = Gia_ManHasMapping(_nNewNodesMax_local);
  if (iVar2 == 0) {
    local_b8 = Gia_ManDup(_nNewNodesMax_local);
  }
  else {
    local_b8 = (Gia_Man_t *)Dsm_ManDeriveGia(_nNewNodesMax_local,0);
  }
  pNew = local_b8;
  Gia_ManTransferTiming(local_b8,_nNewNodesMax_local);
  if (pNew0._4_4_ != 0) {
    Gia_ManPrintStats(pNew,(Gps_Par_t *)0x0);
  }
  if (fVerbose_local == 0) {
    local_c0 = Gia_ManDupMuxes(pNew,2);
  }
  else {
    local_c0 = Gia_ManDup(pNew);
  }
  pNew1 = local_c0;
  Gia_ManTransferTiming(local_c0,pNew);
  if (pNew0._4_4_ != 0) {
    Gia_ManPrintStats(pNew1,(Gps_Par_t *)0x0);
  }
  if (pNew != _nNewNodesMax_local) {
    Gia_ManStop(pNew);
  }
  pNew2 = Dam_ManAreaBalanceInt(pNew1,_Id,fVeryVerbose_local,pNew0._4_4_,(int)pNew0);
  Gia_ManTransferTiming(pNew2,pNew1);
  if (pNew0._4_4_ != 0) {
    Gia_ManPrintStats(pNew2,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(pNew1);
  Vec_IntFreeP((Vec_Int_t **)&Id);
  vCiLevels = (Vec_Int_t *)Gia_ManDupNoMuxes(pNew2,0);
  Gia_ManTransferTiming((Gia_Man_t *)vCiLevels,pNew2);
  if (pNew0._4_4_ != 0) {
    Gia_ManPrintStats((Gia_Man_t *)vCiLevels,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(pNew2);
  iVar2 = Gia_ManIsNormalized((Gia_Man_t *)vCiLevels);
  if (iVar2 == 0) {
    pNew2 = (Gia_Man_t *)vCiLevels;
    vCiLevels = (Vec_Int_t *)Gia_ManDupNormalize((Gia_Man_t *)vCiLevels,0);
    Gia_ManTransferTiming((Gia_Man_t *)vCiLevels,pNew2);
    Gia_ManStop(pNew2);
  }
  return (Gia_Man_t *)vCiLevels;
}

Assistant:

Gia_Man_t * Gia_ManAreaBalance( Gia_Man_t * p, int fSimpleAnd, int nNewNodesMax, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew0, * pNew, * pNew1, * pNew2;
    Vec_Int_t * vCiLevels;
    // set arrival times for the input of the new AIG
    if ( p->vCiArrs )
    {
        int i, Id, And2Delay = p->And2Delay ? p->And2Delay : 1;
        Vec_IntFreeP( &p->vLevels );
        p->vLevels = Vec_IntStart( Gia_ManObjNum(p) );
        Gia_ManForEachCiId( p, Id, i )
            Vec_IntWriteEntry( p->vLevels, Id, Vec_IntEntry(p->vCiArrs, i)/And2Delay );
    }
    else if ( p->vInArrs )
    {
        int i, Id, And2Delay = p->And2Delay ? p->And2Delay : 1;
        Gia_ManForEachCiId( p, Id, i )
            Vec_IntWriteEntry( p->vLevels, Id, (int)(Vec_FltEntry(p->vInArrs, i)/And2Delay) );
    }
    // determine CI levels
    if ( p->pManTime && p->vLevels == NULL )
        Gia_ManLevelWithBoxes( p );
    vCiLevels = Gia_ManGetCiLevels( p );
    // get the starting manager
    pNew0 = Gia_ManHasMapping(p) ? (Gia_Man_t *)Dsm_ManDeriveGia(p, 0) : Gia_ManDup(p);
    Gia_ManTransferTiming( pNew0, p );
    if ( fVerbose )     Gia_ManPrintStats( pNew0, NULL );
    // derive internal manager
    pNew = fSimpleAnd ? Gia_ManDup( pNew0 ) : Gia_ManDupMuxes( pNew0, 2 );
    Gia_ManTransferTiming( pNew, pNew0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    if ( pNew0 != p ) Gia_ManStop( pNew0 );
    // perform the operation
    pNew1 = Dam_ManAreaBalanceInt( pNew, vCiLevels, nNewNodesMax, fVerbose, fVeryVerbose );
    Gia_ManTransferTiming( pNew1, pNew );
    if ( fVerbose )     Gia_ManPrintStats( pNew1, NULL );
    Gia_ManStop( pNew );
    Vec_IntFreeP( &vCiLevels );
    // derive the final result
    pNew2 = Gia_ManDupNoMuxes( pNew1, 0 );
    Gia_ManTransferTiming( pNew2, pNew1 );
    if ( fVerbose )     Gia_ManPrintStats( pNew2, NULL );
    Gia_ManStop( pNew1 );
    // normalize if needed
    if ( !Gia_ManIsNormalized(pNew2) )
    {
        pNew2 = Gia_ManDupNormalize( pNew1 = pNew2, 0 );
        Gia_ManTransferTiming( pNew2, pNew1 );
        Gia_ManStop( pNew1 );
    }
    //Gia_ManTransferTiming( pNew2, p );
    return pNew2;
}